

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  int iVar1;
  CppType CVar2;
  undefined4 extraout_var;
  UnknownFieldSet *this_00;
  long *plVar4;
  int iVar5;
  int i;
  ulong uVar6;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  long *plVar3;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  this_00 = (UnknownFieldSet *)(**(code **)(*plVar3 + 0x18))(plVar3,message);
  UnknownFieldSet::Clear(this_00);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar3 + 0x80))(plVar3,message);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar6 = uVar6 + 1) {
    this = local_48._M_impl.super__Vector_impl_data._M_start[uVar6];
    CVar2 = FieldDescriptor::cpp_type(this);
    if (CVar2 == CPPTYPE_MESSAGE) {
      if (*(int *)(this + 0x4c) == 3) {
        iVar1 = (**(code **)(*plVar3 + 0x30))(plVar3,message,this);
        iVar5 = 0;
        if (iVar1 < 1) {
          iVar1 = iVar5;
        }
        for (; iVar1 != iVar5; iVar5 = iVar5 + 1) {
          plVar4 = (long *)(**(code **)(*plVar3 + 0x200))(plVar3,message,this,iVar5);
          (**(code **)(*plVar4 + 0x98))(plVar4);
        }
      }
      else {
        plVar4 = (long *)(**(code **)(*plVar3 + 0x138))(plVar3,message,this,0);
        (**(code **)(*plVar4 + 0x98))(plVar4);
      }
    }
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = message->GetReflection();

  reflection->MutableUnknownFields(message)->Clear();

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (field->is_repeated()) {
        int size = reflection->FieldSize(*message, field);
        for (int j = 0; j < size; j++) {
          reflection->MutableRepeatedMessage(message, field, j)
                    ->DiscardUnknownFields();
        }
      } else {
        reflection->MutableMessage(message, field)->DiscardUnknownFields();
      }
    }
  }
}